

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O0

bool bloaty::pe::ReadMagic(string_view *data)

{
  size_type sVar1;
  short *psVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  uint16_t magic;
  undefined1 local_1;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  if (sVar1 < 0x40) {
    local_1 = false;
  }
  else {
    psVar2 = (short *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDI);
    local_1 = *psVar2 == 0x5a4d;
  }
  return local_1;
}

Assistant:

bool ReadMagic(const string_view& data) {
  // If the size is smaller than a dos header, it cannot be a PE file, right?
  if (data.size() < sizeof(pe_dos_header)) {
    return false;
  }

  uint16_t magic;
  memcpy(&magic, data.data(), sizeof(magic));

  return magic == dos_magic;
}